

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O2

void __thiscall chrono::ChMarker::ArchiveOUT(ChMarker *this,ChArchiveOut *marchive)

{
  eChMarkerMotion_mapper mmapper;
  ChEnumMapper<chrono::ChMarker::eChMarkerMotion> local_f0;
  ChEnumMapper<chrono::ChMarker::eChMarkerMotion> local_d0;
  ChNameValue<chrono::ChVector<double>_> local_b0;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_98;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_80;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_68;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_50;
  ChNameValue<chrono::ChEnumMapper<chrono::ChMarker::eChMarkerMotion>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChMarker>(marchive);
  ChObj::ArchiveOUT(&this->super_ChObj,marchive);
  ChFrameMoving<double>::ArchiveOUT(&this->super_ChFrameMoving<double>,marchive);
  eChMarkerMotion_mapper::eChMarkerMotion_mapper((eChMarkerMotion_mapper *)&local_d0);
  eChMarkerMotion_mapper::operator()
            (&local_f0,(eChMarkerMotion_mapper *)&local_d0,&this->motion_type);
  local_38._name = "motion_type";
  local_38._flags = '\0';
  local_38._value = &local_f0;
  ChArchiveOut::operator<<(marchive,&local_38);
  ChEnumMapper<chrono::ChMarker::eChMarkerMotion>::~ChEnumMapper(&local_f0);
  local_50._value = &this->motion_X;
  local_50._name = "motion_X";
  local_50._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_50);
  local_68._value = &this->motion_Y;
  local_68._name = "motion_Y";
  local_68._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_68);
  local_80._value = &this->motion_Z;
  local_80._name = "motion_Z";
  local_80._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_80);
  local_98._value = &this->motion_ang;
  local_98._name = "motion_ang";
  local_98._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_98);
  local_b0._value = &this->motion_axis;
  local_b0._name = "motion_axis";
  local_b0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_b0);
  ChEnumMapper<chrono::ChMarker::eChMarkerMotion>::~ChEnumMapper(&local_d0);
  return;
}

Assistant:

void ChMarker::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChMarker>();

    // serialize parent class
    ChObj::ArchiveOUT(marchive);
    // serialize parent class
    ChFrameMoving<double>::ArchiveOUT(marchive);

    // serialize all member data:
    eChMarkerMotion_mapper mmapper;
    marchive << CHNVP(mmapper(motion_type), "motion_type");
    marchive << CHNVP(motion_X);
    marchive << CHNVP(motion_Y);
    marchive << CHNVP(motion_Z);
    marchive << CHNVP(motion_ang);
    marchive << CHNVP(motion_axis);
}